

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

ostream * covenant::operator<<(ostream *o,vector<covenant::Sym,_std::allocator<covenant::Sym>_> *v)

{
  pointer pSVar1;
  uint uVar2;
  ostream *poVar3;
  
  std::operator<<(o,"[");
  uVar2 = 0;
  while( true ) {
    pSVar1 = (v->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(v->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pSVar1 >> 2) <= (ulong)uVar2)
    break;
    poVar3 = operator<<(o,(Sym)pSVar1[uVar2].x);
    std::operator<<(poVar3,";");
    uVar2 = uVar2 + 1;
  }
  std::operator<<(o,"]");
  return o;
}

Assistant:

inline ostream& operator<<(ostream& o, const vector<T> &v) {
    o << "[";
    for (unsigned i=0; i < v.size(); i++)
      o << v[i] << ";" ;
    o << "]";
    return o;
  }